

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxDoWhileLoop::FxDoWhileLoop
          (FxDoWhileLoop *this,FxExpression *condition,FxExpression *code,FScriptPosition *pos)

{
  FxLoopStatement::FxLoopStatement(&this->super_FxLoopStatement,EFX_DoWhileLoop,pos);
  (this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxDoWhileLoop_00706fe8;
  this->Condition = condition;
  this->Code = code;
  (this->super_FxLoopStatement).super_FxExpression.ValueType = &TypeVoid->super_PType;
  return;
}

Assistant:

FxDoWhileLoop::FxDoWhileLoop(FxExpression *condition, FxExpression *code, const FScriptPosition &pos)
: FxLoopStatement(EFX_DoWhileLoop, pos), Condition(condition), Code(code)
{
	ValueType = TypeVoid;
}